

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_check_ext_instance
              (lys_module *module,lys_ext_instance ***ext,uint size,void *parent,unres_schema *unres
              )

{
  int iVar1;
  lys_node *snode;
  uint local_44;
  uint i;
  unres_ext *info;
  unres_schema *unres_local;
  void *parent_local;
  uint size_local;
  lys_ext_instance ***ext_local;
  lys_module *module_local;
  
  local_44 = 0;
  while( true ) {
    if (size <= local_44) {
      return 0;
    }
    snode = (lys_node *)malloc(0x30);
    snode->name = (char *)(*ext)[local_44]->parent;
    *(undefined4 *)&snode->dsc = 1;
    snode->ref = (char *)parent;
    *(lys_module **)&snode->flags = module;
    *(uint *)&snode->ext = (uint)(*ext)[local_44]->parent_type;
    *(uint *)((long)&snode->ext + 4) = (uint)(*ext)[local_44]->insubstmt;
    *(uint8_t *)&snode->iffeature = (*ext)[local_44]->insubstmt_index;
    *(char *)((long)&snode->iffeature + 1) = (char)local_44;
    iVar1 = unres_schema_add_node(module,unres,ext,UNRES_EXT,snode);
    if (iVar1 == -1) break;
    local_44 = local_44 + 1;
  }
  return 1;
}

Assistant:

int
yang_check_ext_instance(struct lys_module *module, struct lys_ext_instance ***ext, uint size,
                        void *parent, struct unres_schema *unres)
{
    struct unres_ext *info;
    uint i;

    for (i = 0; i < size; ++i) {
        info = malloc(sizeof *info);
        info->data.yang = (*ext)[i]->parent;
        info->datatype = LYS_IN_YANG;
        info->parent = parent;
        info->mod = module;
        info->parent_type = (*ext)[i]->parent_type;
        info->substmt = (*ext)[i]->insubstmt;
        info->substmt_index = (*ext)[i]->insubstmt_index;
        info->ext_index = i;
        if (unres_schema_add_node(module, unres, ext, UNRES_EXT, (struct lys_node *)info) == -1) {
            return EXIT_FAILURE;
        }
    }

    return EXIT_SUCCESS;
}